

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BaseImporter.cpp
# Opt level: O1

void __thiscall Assimp::BatchData::BatchData(BatchData *this,IOSystem *pIO,bool validate)

{
  Importer *this_00;
  
  this->pIOSystem = pIO;
  this->pImporter = (Importer *)0x0;
  (this->requests).super__List_base<Assimp::LoadRequest,_std::allocator<Assimp::LoadRequest>_>.
  _M_impl._M_node.super__List_node_base._M_prev = (_List_node_base *)&this->requests;
  (this->requests).super__List_base<Assimp::LoadRequest,_std::allocator<Assimp::LoadRequest>_>.
  _M_impl._M_node.super__List_node_base._M_next = (_List_node_base *)&this->requests;
  (this->requests).super__List_base<Assimp::LoadRequest,_std::allocator<Assimp::LoadRequest>_>.
  _M_impl._M_node._M_size = 0;
  (this->pathBase)._M_dataplus._M_p = (pointer)&(this->pathBase).field_2;
  (this->pathBase)._M_string_length = 0;
  (this->pathBase).field_2._M_local_buf[0] = '\0';
  this->next_id = 0xffff;
  this->validate = validate;
  if (pIO != (IOSystem *)0x0) {
    this_00 = (Importer *)operator_new(8);
    Importer::Importer(this_00);
    this->pImporter = this_00;
    Importer::SetIOHandler(this_00,pIO);
    return;
  }
  __assert_fail("nullptr != pIO",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/hbina[P]fatuous/thirdparty/assimp/code/Common/BaseImporter.cpp"
                ,0x1fd,"Assimp::BatchData::BatchData(IOSystem *, bool)");
}

Assistant:

BatchData( IOSystem* pIO, bool validate )
    : pIOSystem( pIO )
    , pImporter( nullptr )
    , next_id(0xffff)
    , validate( validate ) {
        ai_assert( nullptr != pIO );
        
        pImporter = new Importer();
        pImporter->SetIOHandler( pIO );
    }